

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesImpl<true,false,true>
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  double dVar2;
  double *pdVar3;
  double *in_RCX;
  long in_RSI;
  long in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  V_Real vSum;
  double local_1a8;
  double local_188;
  double dStack_180;
  int local_14c;
  double local_148;
  double dStack_140;
  double local_c8;
  double derivative_1;
  double sumSquared;
  double sum;
  V_Real patternWeight;
  V_Real derivative;
  V_Real denominator;
  V_Real numerator;
  int k;
  V_Real vSumSquared;
  
  local_148 = 0.0;
  dStack_140 = 0.0;
  for (local_14c = 0; local_14c < *(int *)(in_RDI + 0x14) + -1; local_14c = local_14c + 2) {
    auVar1 = vdivpd_avx(*(undefined1 (*) [16])(*(long *)(in_RDI + 0x100) + (long)local_14c * 8),
                        *(undefined1 (*) [16])(*(long *)(in_RDI + 0xf8) + (long)local_14c * 8));
    pdVar3 = (double *)(*(long *)(in_RDI + 0x80) + (long)local_14c * 8);
    dVar4 = *pdVar3;
    dVar2 = pdVar3[1];
    pdVar3 = (double *)(in_RSI + (long)local_14c * 8);
    local_188 = auVar1._0_8_;
    dStack_180 = auVar1._8_8_;
    *pdVar3 = local_188;
    pdVar3[1] = dStack_180;
    local_148 = local_188 * local_188 * dVar4 + local_148;
    dStack_140 = dStack_180 * dStack_180 * dVar2 + dStack_140;
  }
  auVar1._8_8_ = dStack_140;
  auVar1._0_8_ = local_148;
  auVar1 = vpermilpd_avx(auVar1,1);
  local_c8 = auVar1._0_8_;
  local_1a8 = local_148 + local_c8;
  for (; local_14c < *(int *)(in_RDI + 0x14); local_14c = local_14c + 1) {
    dVar4 = *(double *)(*(long *)(in_RDI + 0x100) + (long)local_14c * 8) /
            *(double *)(*(long *)(in_RDI + 0xf8) + (long)local_14c * 8);
    *(double *)(in_RSI + (long)local_14c * 8) = dVar4;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_14c * 8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_1a8;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar4 * dVar4;
    auVar1 = vfmadd213sd_fma(auVar5,auVar6,auVar7);
    local_1a8 = auVar1._0_8_;
  }
  *in_RCX = local_1a8;
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    V_Real vSum = VEC_SETZERO();
    V_Real vSumSquared = VEC_SETZERO();

    int k = 0;
    for (; k < kPatternCount - 1; k += 2) {

        V_Real numerator = VEC_LOAD(grandNumeratorDerivTmp + k);
        V_Real denominator = VEC_LOAD(grandDenominatorDerivTmp + k);
        V_Real derivative = VEC_DIV(numerator, denominator);
        V_Real patternWeight = VEC_LOAD(gPatternWeights + k);

        if (DoDerivatives) {
            VEC_STOREU(outDerivatives + k, derivative);
        }

        if (DoSum) {
            vSum = VEC_MADD(derivative, patternWeight, vSum);
        }

        if (DoSumSquared) {
            derivative = VEC_MULT(derivative, derivative);
            vSumSquared = VEC_MADD(derivative, patternWeight, vSumSquared);
        }
    }

    double sum;
    double sumSquared;

    if (DoSum) {
        sum = _mm_cvtsd_f64(VEC_ADD(vSum, VEC_SWAP(vSum)));
    }

    if (DoSumSquared) {
        sumSquared = _mm_cvtsd_f64(VEC_ADD(vSumSquared, VEC_SWAP(vSumSquared)));
    }

    for (; k < kPatternCount; ++k) {
        double derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) {
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}